

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

flatcc_builder_ref_t
flatcc_builder_create_vector
          (flatcc_builder_t *B,void *data,size_t count,size_t elem_size,uint16_t align,
          size_t max_count)

{
  uint size;
  flatbuffers_uoffset_t fVar1;
  undefined1 local_e0 [8];
  flatcc_iov_state_t iov;
  flatbuffers_uoffset_t length_prefix;
  flatbuffers_uoffset_t vec_pad;
  flatbuffers_uoffset_t vec_size;
  size_t max_count_local;
  size_t sStack_30;
  uint16_t align_local;
  size_t elem_size_local;
  size_t count_local;
  void *data_local;
  flatcc_builder_t *B_local;
  
  max_count_local._6_2_ = align;
  sStack_30 = elem_size;
  elem_size_local = count;
  count_local = (size_t)data;
  data_local = B;
  if (max_count < count) {
    if (max_count < count) {
      __assert_fail("count <= max_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x572,
                    "flatcc_builder_ref_t flatcc_builder_create_vector(flatcc_builder_t *, const void *, size_t, size_t, uint16_t, size_t)"
                   );
    }
    B_local._4_4_ = 0;
  }
  else {
    get_min_align((uint16_t *)((long)&max_count_local + 6),4);
    set_min_align((flatcc_builder_t *)data_local,max_count_local._6_2_);
    size = (flatbuffers_uoffset_t)elem_size_local * (int)sStack_30;
    __flatbuffers_uoffset_write_to_pe
              ((void *)((long)&iov.iov[7].iov_len + 4),(flatbuffers_uoffset_t)elem_size_local);
    fVar1 = front_pad((flatcc_builder_t *)data_local,size,max_count_local._6_2_);
    local_e0 = (undefined1  [8])0x4;
    iov._8_8_ = (long)&iov.iov[7].iov_len + 4;
    iov.iov[0].iov_base = (void *)0x4;
    iov.len._0_4_ = 1;
    if (size != 0) {
      local_e0 = (undefined1  [8])((ulong)size + 4);
      iov.iov[0].iov_len = count_local;
      iov.iov[1].iov_base = (void *)(ulong)size;
      iov.len._0_4_ = 2;
    }
    if (fVar1 != 0) {
      local_e0 = (undefined1  [8])((ulong)fVar1 + (long)local_e0);
      iov.iov[(long)(int)iov.len + -1].iov_len = (size_t)"";
      iov.iov[(int)iov.len].iov_base = (void *)(ulong)fVar1;
      iov.len._0_4_ = (int)iov.len + 1;
    }
    B_local._4_4_ = emit_front((flatcc_builder_t *)data_local,(flatcc_iov_state_t *)local_e0);
  }
  return B_local._4_4_;
}

Assistant:

flatcc_builder_ref_t flatcc_builder_create_vector(flatcc_builder_t *B,
        const void *data, size_t count, size_t elem_size, uint16_t align, size_t max_count)
{
    /*
     * Note: it is important that vec_size is uoffset not size_t
     * in case sizeof(uoffset_t) > sizeof(size_t) because max_count is
     * defined in terms of uoffset_t representation size, and also
     * because we risk accepting too large a vector even if max_count is
     * not violated.
     */
    uoffset_t vec_size, vec_pad, length_prefix;
    iov_state_t iov;

    check_error(count <= max_count, 0, "vector max_count violated");
    get_min_align(&align, field_size);
    set_min_align(B, align);
    vec_size = (uoffset_t)count * (uoffset_t)elem_size;
    /*
     * That can happen on 32 bit systems when uoffset_t is defined as 64-bit.
     * `emit_front/back` captures overflow, but not if our size type wraps first.
     */
#if FLATBUFFERS_UOFFSET_MAX > SIZE_MAX
    check_error(vec_size < SIZE_MAX, 0, "vector larger than address space");
#endif
    write_uoffset(&length_prefix, (uoffset_t)count);
    /* Alignment is calculated for the first element, not the header. */
    vec_pad = front_pad(B, vec_size, align);
    init_iov();
    push_iov(&length_prefix, field_size);
    push_iov(data, vec_size);
    push_iov(_pad, vec_pad);
    return emit_front(B, &iov);
}